

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
CartesianProductGenerator<BLOCK_SIZE,int,void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long),void(*)(int,int,short*,long,unsigned_char_const*,long,unsigned_char_const*,long)>
::IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul>>::AdvanceIfEnd<2ul>
          (IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul>> *this)

{
  bool bVar1;
  
  bVar1 = ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>
          ::operator!=((ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>
                        *)(this + 0x58),
                       (ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>
                        *)(this + 0x38));
  if (bVar1) {
    return;
  }
  ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>
  ::operator=((ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>
               *)(this + 0x58),
              (ParamIterator<void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>
               *)(this + 0x18));
  (**(code **)(**(long **)(this + 0x60) + 0x18))();
  AdvanceIfEnd<1ul>(this);
  return;
}

Assistant:

void AdvanceIfEnd() {
      if (std::get<ThisI>(current_) != std::get<ThisI>(end_)) return;

      bool last = ThisI == 0;
      if (last) {
        // We are done. Nothing else to propagate.
        return;
      }

      constexpr size_t NextI = ThisI - (ThisI != 0);
      std::get<ThisI>(current_) = std::get<ThisI>(begin_);
      ++std::get<NextI>(current_);
      AdvanceIfEnd<NextI>();
    }